

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O2

int Curl_splayremovebyaddr(Curl_tree *t,Curl_tree *removenode,Curl_tree **newroot)

{
  Curl_tree *pCVar1;
  __suseconds_t _Var2;
  Curl_tree *pCVar3;
  
  if (removenode == (Curl_tree *)0x0 || t == (Curl_tree *)0x0) {
    return 1;
  }
  if (((removenode->key).tv_sec & (removenode->key).tv_usec) == 0xffffffffffffffff) {
    pCVar3 = removenode->smaller;
    if (pCVar3 == (Curl_tree *)0x0) {
      return 3;
    }
    pCVar1 = removenode->same;
    pCVar3->same = pCVar1;
    if (pCVar1 != (Curl_tree *)0x0) {
      pCVar1->smaller = pCVar3;
    }
    removenode->smaller = (Curl_tree *)0x0;
  }
  else {
    pCVar3 = Curl_splay(removenode->key,t);
    if (pCVar3 != removenode) {
      return 2;
    }
    t = pCVar3->same;
    if (t == (Curl_tree *)0x0) {
      if (pCVar3->smaller == (Curl_tree *)0x0) {
        t = pCVar3->larger;
      }
      else {
        t = Curl_splay(removenode->key,pCVar3->smaller);
        t->larger = pCVar3->larger;
      }
    }
    else {
      _Var2 = (pCVar3->key).tv_usec;
      (t->key).tv_sec = (pCVar3->key).tv_sec;
      (t->key).tv_usec = _Var2;
      pCVar1 = pCVar3->larger;
      t->smaller = pCVar3->smaller;
      t->larger = pCVar1;
    }
  }
  *newroot = t;
  return 0;
}

Assistant:

int Curl_splayremovebyaddr(struct Curl_tree *t,
                           struct Curl_tree *removenode,
                           struct Curl_tree **newroot)
{
  static const struct timeval KEY_NOTUSED = {-1, -1}; /* will *NEVER* appear */
  struct Curl_tree *x;

  if(!t || !removenode)
    return 1;

  if(compare(KEY_NOTUSED, removenode->key) == 0) {
    /* Key set to NOTUSED means it is a subnode within a 'same' linked list
       and thus we can unlink it easily. The 'smaller' link of a subnode
       links to the parent node. */
    if(removenode->smaller == NULL)
      return 3;

    removenode->smaller->same = removenode->same;
    if(removenode->same)
      removenode->same->smaller = removenode->smaller;

    /* Ensures that double-remove gets caught. */
    removenode->smaller = NULL;

    /* voila, we're done! */
    *newroot = t; /* return the same root */
    return 0;
  }

  t = Curl_splay(removenode->key, t);

  /* First make sure that we got the same root node as the one we want
     to remove, as otherwise we might be trying to remove a node that
     isn't actually in the tree.

     We cannot just compare the keys here as a double remove in quick
     succession of a node with key != KEY_NOTUSED && same != NULL
     could return the same key but a different node. */
  if(t != removenode)
    return 2;

  /* Check if there is a list with identical sizes, as then we're trying to
     remove the root node of a list of nodes with identical keys. */
  x = t->same;
  if(x) {
    /* 'x' is the new root node, we just make it use the root node's
       smaller/larger links */

    x->key = t->key;
    x->larger = t->larger;
    x->smaller = t->smaller;
  }
  else {
    /* Remove the root node */
    if(t->smaller == NULL)
      x = t->larger;
    else {
      x = Curl_splay(removenode->key, t->smaller);
      x->larger = t->larger;
    }
  }

  *newroot = x; /* store new root pointer */

  return 0;
}